

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_set_auto_verify(Boolean value)

{
  Boolean BVar1;
  
  ma_stats.calls[0x18] = ma_stats.calls[0x18] + 1;
  BVar1 = ma_auto_verify;
  ma_auto_verify = value;
  return BVar1;
}

Assistant:

public Boolean MA_set_auto_verify(Boolean  value /* to set flag to */)
{
    Boolean    old_value;    /* of flag */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_set_auto_verify]++;
#endif /* STATS */

    old_value = ma_auto_verify;
    ma_auto_verify = value;
    return old_value;
}